

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O1

void test_bhdct_get_populated_multiple(planck_unit_test_t *tc)

{
  int iVar1;
  int iVar2;
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  int local_a0;
  int local_9c;
  ion_dictionary_t local_98;
  ion_dictionary_handler_t local_80;
  
  bhdct_setup(tc,&local_80,&local_98,ion_fill_low);
  iVar1 = 0;
  iVar2 = 0;
  do {
    local_a0 = iVar1;
    local_9c = iVar2;
    bhdct_get(tc,&local_98,&local_9c,&local_a0,'\0',1);
    iVar2 = iVar2 + 1;
    iVar1 = iVar1 + 2;
  } while (iVar2 != 10);
  bhdct_delete_dictionary(tc,&local_98);
  bhdct_close_master_table(tc);
  bhdct_delete_master_table(tc);
  return;
}

Assistant:

void
test_bhdct_get_populated_multiple(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;

	bhdct_setup(tc, &handler, &dict, ion_fill_low);

	int i;

	ION_FILL_LOW_LOOP(i) {
		bhdct_get(tc, &dict, IONIZE(i, int), ION_LOW_VALUE(i), err_ok, 1);
	}

	bhdct_takedown(tc, &dict);
}